

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O3

void __thiscall
cmExportFileGenerator::PopulateIncludeDirectoriesInterface
          (cmExportFileGenerator *this,cmGeneratorTarget *target,PreprocessContext preprocessRule,
          ImportPropertyMap *properties,cmTargetExport *te,string *includesDestinationDirs)

{
  element_type *peVar1;
  pointer pcVar2;
  undefined1 this_00 [8];
  bool bVar3;
  cmValue cVar4;
  cmake *cmakeInstance;
  cmLocalGenerator *pcVar5;
  string *psVar6;
  ostream *poVar7;
  mapped_type *pmVar8;
  char *__end;
  char *__lhs;
  string prepro;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  string exportDirs;
  string dirs;
  cmGeneratorExpression ge;
  string includes;
  string local_290;
  undefined1 local_270 [8];
  undefined1 local_268 [32];
  ImportPropertyMap *local_248;
  cmExportFileGenerator *local_240;
  string local_238;
  string local_218;
  element_type **local_1f8 [2];
  element_type *local_1e8 [2];
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_1d8;
  undefined1 local_1c0 [24];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_240 = this;
  if (preprocessRule != InstallInterface) {
    __assert_fail("preprocessRule == cmGeneratorExpression::InstallInterface",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmExportFileGenerator.cxx"
                  ,0x189,
                  "void cmExportFileGenerator::PopulateIncludeDirectoriesInterface(const cmGeneratorTarget *, cmGeneratorExpression::PreprocessContext, ImportPropertyMap &, const cmTargetExport &, std::string &)"
                 );
  }
  includesDestinationDirs->_M_string_length = 0;
  *(includesDestinationDirs->_M_dataplus)._M_p = '\0';
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"INTERFACE_INCLUDE_DIRECTORIES","");
  cVar4 = cmGeneratorTarget::GetProperty(target,(string *)local_1a8);
  local_248 = properties;
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  cmakeInstance = cmMakefile::GetCMakeInstance(target->Makefile);
  local_1d8.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_1d8.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_1d8);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)local_1c0,cmakeInstance,(cmListFileBacktrace *)&local_1d8);
  if (local_1d8.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1d8.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_238._0_16_ = cmTarget::GetInstallIncludeDirectoriesEntries_abi_cxx11_(target->Target,te);
  cmList::
  to_string<cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_0>
            ((string *)local_1a8,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&local_238);
  cmGeneratorExpression::Preprocess(&local_218,(string *)local_1a8,InstallInterface,true);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  (*local_240->_vptr_cmExportFileGenerator[0x14])(local_240,&local_218);
  local_1f8[0] = local_1e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1f8,local_218._M_dataplus._M_p,
             local_218._M_dataplus._M_p + local_218._M_string_length);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_270,(string *)local_1c0);
  if (local_1f8[0] != local_1e8) {
    operator_delete(local_1f8[0],(ulong)((long)&(local_1e8[0]->Value).Name._M_dataplus._M_p + 1));
  }
  this_00 = local_270;
  pcVar5 = cmGeneratorTarget::GetLocalGenerator(target);
  local_1a8._0_8_ = local_1a8 + 0x10;
  __lhs = "";
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"","");
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  local_290._M_string_length = 0;
  local_290.field_2._M_local_buf[0] = '\0';
  psVar6 = cmCompiledGeneratorExpression::Evaluate
                     ((cmCompiledGeneratorExpression *)this_00,pcVar5,(string *)local_1a8,target,
                      (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_290);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  pcVar2 = (psVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,pcVar2,pcVar2 + psVar6->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,
                    CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                             local_290.field_2._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (*(bool *)((long)local_270 + 0x130) == true) {
    pcVar5 = cmGeneratorTarget::GetLocalGenerator(target);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8);
    psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               "\" is installed with INCLUDES DESTINATION set to a context sensitive path.  Paths which depend on the configuration, policy values or the link interface are not supported.  Consider using target_include_directories instead."
               ,0xde);
    std::__cxx11::stringbuf::str();
    cmLocalGenerator::IssueMessage(pcVar5,FATAL_ERROR,&local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,
                      CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                               local_290.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    goto LAB_005042f2;
  }
  if (cVar4.Value == (string *)0x0) {
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_238._M_string_length ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) goto LAB_005042f2;
LAB_00504128:
    prefixItems(&local_238);
    std::__cxx11::string::_M_assign((string *)includesDestinationDirs);
    local_1a8._0_8_ = local_1a8 + 0x10;
    if (cVar4.Value == (string *)0x0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"","");
    }
    else {
      pcVar2 = ((cVar4.Value)->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a8,pcVar2,pcVar2 + (cVar4.Value)->_M_string_length);
      __lhs = ";";
    }
    std::operator+(&local_290,__lhs,&local_238);
    std::__cxx11::string::_M_append(local_1a8,(ulong)local_290._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,
                      CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                               local_290.field_2._M_local_buf[0]) + 1);
    }
    cmGeneratorExpression::Preprocess(&local_290,(string *)local_1a8,InstallInterface,true);
    if (local_290._M_string_length != 0) {
      pcVar5 = cmGeneratorTarget::GetLocalGenerator(target);
      ResolveTargetsInGeneratorExpression(local_240,&local_290,target,pcVar5);
      peVar1 = (element_type *)(local_268 + 0x10);
      local_268._0_8_ = peVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_268,"INTERFACE_INCLUDE_DIRECTORIES","");
      bVar3 = checkInterfaceDirs(&local_290,target,(string *)local_268);
      if ((element_type *)local_268._0_8_ != peVar1) {
        operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
      }
      if (bVar3) {
        local_268._0_8_ = peVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_268,"INTERFACE_INCLUDE_DIRECTORIES","");
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](local_248,(key_type *)local_268);
        std::__cxx11::string::_M_assign((string *)pmVar8);
        if ((element_type *)local_268._0_8_ != peVar1) {
          operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,
                      CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                               local_290.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_238._M_string_length !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0 ||
        (cVar4.Value)->_M_string_length != 0) goto LAB_00504128;
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"INTERFACE_INCLUDE_DIRECTORIES","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_248,(key_type *)local_1a8);
    pmVar8->_M_string_length = 0;
    *(pmVar8->_M_dataplus)._M_p = '\0';
  }
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
LAB_005042f2:
  if ((cmStringRange *)local_238._M_dataplus._M_p != (cmStringRange *)&local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_1c0);
  return;
}

Assistant:

void cmExportFileGenerator::PopulateIncludeDirectoriesInterface(
  cmGeneratorTarget const* target,
  cmGeneratorExpression::PreprocessContext preprocessRule,
  ImportPropertyMap& properties, cmTargetExport const& te,
  std::string& includesDestinationDirs)
{
  assert(preprocessRule == cmGeneratorExpression::InstallInterface);

  includesDestinationDirs.clear();

  const char* propName = "INTERFACE_INCLUDE_DIRECTORIES";
  cmValue input = target->GetProperty(propName);

  cmGeneratorExpression ge(*target->Makefile->GetCMakeInstance());

  std::string dirs = cmGeneratorExpression::Preprocess(
    cmList::to_string(target->Target->GetInstallIncludeDirectoriesEntries(te)),
    preprocessRule, true);
  this->ReplaceInstallPrefix(dirs);
  std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(dirs);
  std::string exportDirs =
    cge->Evaluate(target->GetLocalGenerator(), "", target);

  if (cge->GetHadContextSensitiveCondition()) {
    cmLocalGenerator* lg = target->GetLocalGenerator();
    std::ostringstream e;
    e << "Target \"" << target->GetName()
      << "\" is installed with "
         "INCLUDES DESTINATION set to a context sensitive path.  Paths which "
         "depend on the configuration, policy values or the link interface "
         "are "
         "not supported.  Consider using target_include_directories instead.";
    lg->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }

  if (!input && exportDirs.empty()) {
    return;
  }
  if ((input && input->empty()) && exportDirs.empty()) {
    // Set to empty
    properties[propName].clear();
    return;
  }

  prefixItems(exportDirs);
  includesDestinationDirs = exportDirs;

  std::string includes = (input ? *input : "");
  const char* sep = input ? ";" : "";
  includes += sep + exportDirs;
  std::string prepro =
    cmGeneratorExpression::Preprocess(includes, preprocessRule, true);
  if (!prepro.empty()) {
    this->ResolveTargetsInGeneratorExpressions(prepro, target);

    if (!checkInterfaceDirs(prepro, target, propName)) {
      return;
    }
    properties[propName] = prepro;
  }
}